

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2.c
# Opt level: O0

MPP_RET iep2_done(iep2_api_ctx *ctx)

{
  int iVar1;
  undefined1 local_54 [8];
  mv_list ls;
  iep2_api_ctx *ctx_local;
  
  ls._60_8_ = ctx;
  if ((iep_debug & 2) != 0) {
    _mpp_log_l(4,(char *)0x0,"iep:deinterlace detect osd cnt %d, combo %d\n",(char *)0x0,
               (ulong)(ctx->output).dect_osd_cnt,(ulong)(ctx->output).out_osd_comb_cnt);
  }
  if (((*(int *)(ls._60_8_ + 0x68) == 1) || (*(int *)(ls._60_8_ + 0x68) == 2)) ||
     (*(int *)(ls._60_8_ + 0x68) == 3)) {
    memset(local_54,0,0x44);
    iep2_update_gmv((iep2_api_ctx *)ls._60_8_,(mv_list *)local_54);
    iep2_check_ffo((iep2_api_ctx *)ls._60_8_);
    iep2_check_pd((iep2_api_ctx *)ls._60_8_);
    get_param_from_env((iep2_api_ctx *)ls._60_8_);
  }
  if ((*(int *)(ls._60_8_ + 0x68) == 9) || (*(int *)(ls._60_8_ + 0x68) == 7)) {
    iep2_check_ffo((iep2_api_ctx *)ls._60_8_);
    iep2_check_pd((iep2_api_ctx *)ls._60_8_);
    get_param_from_env((iep2_api_ctx *)ls._60_8_);
  }
  if (*(int *)(ls._60_8_ + 0x4cc) != 4) {
    *(undefined4 *)(ls._60_8_ + 0x68) = 7;
    iVar1 = iep2_pd_get_output((iep2_pd_info *)(ls._60_8_ + 0x48c));
    *(int *)(ls._60_8_ + 0x1e4) = iVar1;
  }
  return MPP_OK;
}

Assistant:

static MPP_RET iep2_done(struct iep2_api_ctx *ctx)
{
    iep_dbg_trace("deinterlace detect osd cnt %d, combo %d\n",
                  ctx->output.dect_osd_cnt,
                  ctx->output.out_osd_comb_cnt);

    if (ctx->params.dil_mode == IEP2_DIL_MODE_I5O2 ||
        ctx->params.dil_mode == IEP2_DIL_MODE_I5O1T ||
        ctx->params.dil_mode == IEP2_DIL_MODE_I5O1B) {
        struct mv_list ls;

#if IEP2_OSD_EN
        iep2_set_osd(ctx, &ls);
#else
        memset(&ls, 0, sizeof(struct mv_list));
#endif
        iep2_update_gmv(ctx, &ls);
        iep2_check_ffo(ctx);
        iep2_check_pd(ctx);
        get_param_from_env(ctx);
#if 0
        if (ctx->params.roi_en && ctx->params.osd_area_num > 0) {
            struct iep2_rect r;

            ctx->params.roi_layer_num = 0;

            r.x = 0;
            r.y = 0;
            r.w = ctx->params.tile_cols;
            r.h = ctx->params.tile_rows;
            iep2_set_roi(ctx, &r, ROI_MODE_MA);

            r.x = ctx->params.osd_x_sta[0];
            r.y = ctx->params.osd_y_sta[0];
            r.w = ctx->params.osd_x_end[0] - ctx->params.osd_x_sta[0];
            r.h = ctx->params.osd_y_end[0] - ctx->params.osd_y_sta[0];
            iep2_set_roi(ctx, &r, ROI_MODE_MA_MC);
        }
#endif
    }

    if (ctx->params.dil_mode == IEP2_DIL_MODE_DECT ||
        ctx->params.dil_mode == IEP2_DIL_MODE_PD) {
        iep2_check_ffo(ctx);
        iep2_check_pd(ctx);
        get_param_from_env(ctx);
    }

    if (ctx->pd_inf.pdtype != PD_TYPES_UNKNOWN) {
        ctx->params.dil_mode = IEP2_DIL_MODE_PD;
        ctx->params.pd_mode = iep2_pd_get_output(&ctx->pd_inf);
    } else {
        // TODO, revise others mode replace by I5O2
        //ctx->params.dil_mode = IEP2_DIL_MODE_I5O2;
    }

    return 0;
}